

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMeshAddDomains(FmsMesh mesh,char *domain_name,FmsInt num_domains,FmsDomain **domains)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  FmsInt FVar4;
  char **__ptr;
  FmsDomain pFVar5;
  FmsInt i;
  ulong uVar6;
  FmsDomain *local_70;
  FmsInt *local_68;
  char *domain_name_copy;
  
  if (mesh == (FmsMesh)0x0) {
    iVar3 = 1;
  }
  else if (domain_name == (char *)0x0) {
    iVar3 = 2;
  }
  else if (domains == (FmsDomain **)0x0) {
    iVar3 = 3;
  }
  else {
    uVar1 = mesh->num_domain_names;
    __ptr = mesh->domain_names;
    uVar6 = 0;
    iVar3 = 4;
    do {
      if (uVar1 == uVar6) {
        local_68 = mesh->domain_offsets;
        FVar4 = NextPow2(uVar1 + 1);
        if (uVar1 <= FVar4 >> 1) {
          __ptr = (char **)realloc(__ptr,FVar4 * 8);
          if (__ptr == (char **)0x0) {
            return 5;
          }
          mesh->domain_names = __ptr;
          local_68 = (FmsInt *)realloc(local_68,FVar4 * 8 + 8);
          if (local_68 == (FmsInt *)0x0) {
            return 5;
          }
          *local_68 = 0;
          mesh->domain_offsets = local_68;
        }
        uVar6 = mesh->num_domains;
        local_70 = mesh->domains;
        if ((num_domains != 0) && (FVar4 = NextPow2(uVar6 + num_domains), uVar6 <= FVar4 >> 1)) {
          local_70 = (FmsDomain *)realloc(local_70,FVar4 << 3);
          if (local_70 == (FmsDomain *)0x0) {
            return 5;
          }
          mesh->domains = local_70;
        }
        iVar3 = FmsCopyString(domain_name,&domain_name_copy);
        if (iVar3 != 0) {
          return 5;
        }
        FVar4 = 0;
        while( true ) {
          if (num_domains == FVar4) {
            __ptr[uVar1] = domain_name_copy;
            mesh->num_domain_names = uVar1 + 1;
            local_68[uVar1 + 1] = uVar6 + num_domains;
            mesh->num_domains = uVar6 + num_domains;
            *domains = local_70 + uVar6;
            return 0;
          }
          pFVar5 = (FmsDomain)calloc(1,0x138);
          if (pFVar5 == (FmsDomain)0x0) break;
          pFVar5->name = domain_name_copy;
          pFVar5->id = FVar4;
          pFVar5->dim = 0x7f;
          (local_70 + uVar6)[FVar4] = pFVar5;
          FVar4 = FVar4 + 1;
        }
        while (FVar4 != 0) {
          free(local_70[uVar6 + (FVar4 - 1)]);
          FVar4 = FVar4 - 1;
        }
        free(domain_name_copy);
        return 5;
      }
      iVar2 = strcmp(domain_name,__ptr[uVar6]);
      uVar6 = uVar6 + 1;
    } while (iVar2 != 0);
  }
  return iVar3;
}

Assistant:

int FmsMeshAddDomains(FmsMesh mesh, const char *domain_name, FmsInt num_domains,
                      FmsDomain **domains) {
  if (!mesh) { E_RETURN(1); }
  if (!domain_name) { E_RETURN(2); }
  if (!domains) { E_RETURN(3); }
  FmsInt num_domain_names = mesh->num_domain_names;
  char **domain_names = mesh->domain_names;
  // Make sure the 'domain_name' is not already used
  for (FmsInt i = 0; i < num_domain_names; i++) {
    if (strcmp(domain_name, domain_names[i]) == 0) { E_RETURN(4); }
  }
  FmsInt *domain_offsets = mesh->domain_offsets;
  // Reallocate mesh->domain_names and mesh->domain_offsets, if necessary
  FmsInt nc = NextPow2(num_domain_names+1);
  if (num_domain_names <= nc/2) {
    domain_names = realloc(domain_names, nc*sizeof(*domain_names));
    if (domain_names == NULL) { E_RETURN(5); }
    mesh->domain_names = domain_names;
    domain_offsets = realloc(domain_offsets, (nc+1)*sizeof(FmsInt));
    if (domain_offsets == NULL) { E_RETURN(5); }
    domain_offsets[0] = 0;
    mesh->domain_offsets = domain_offsets;
  }
  FmsDomain *m_domains = mesh->domains;
  const FmsInt m_num_domains = mesh->num_domains;
  // Reallocate mesh->domains, if necessary
  if (num_domains != 0) {
    nc = NextPow2(m_num_domains + num_domains);
    if (m_num_domains <= nc/2) {
      m_domains = realloc(m_domains, nc*sizeof(FmsDomain));
      if (m_domains == NULL) { E_RETURN(5); }
      mesh->domains = m_domains;
    }
  }
  char *domain_name_copy;
  if (FmsCopyString(domain_name, &domain_name_copy)) { E_RETURN(5); }
  // On error, call free(domain_name_copy)
  for (FmsInt i = 0; i < num_domains; i++) {
    FmsDomain domain;
    domain = calloc(1, sizeof(*domain));
    if (domain == NULL) {
      while (i != 0) { free(m_domains[m_num_domains + (--i)]); }
      free(domain_name_copy);
      E_RETURN(5);
    }
    // Init the domain name, id, and dim
    domain->name = domain_name_copy;
    domain->id = i;
    domain->dim = FMS_INVALID_DIM;
    m_domains[m_num_domains + i] = domain;
  }
  domain_names[num_domain_names] = domain_name_copy;
  mesh->num_domain_names = ++num_domain_names;
  mesh->num_domains = domain_offsets[num_domain_names] = m_num_domains +
                      num_domains;
  *domains = m_domains + m_num_domains;
  return 0;
}